

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
SimpleStringBuffer::addMemoryDump(SimpleStringBuffer *this,void *memory,size_t memorySize)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  if (memorySize != 0) {
    sVar3 = 0;
    do {
      add(this,"    %04lx: ",sVar3);
      uVar5 = memorySize - sVar3;
      if (0xf < uVar5) {
        uVar5 = 0x10;
      }
      if (memorySize != sVar3) {
        lVar4 = 0;
        do {
          add(this,"%02hx ",(ulong)*(byte *)((long)memory + lVar4 + sVar3));
          if (lVar4 == 7) {
            add(this," ");
          }
          lVar4 = lVar4 + 1;
        } while (uVar5 + (uVar5 == 0) != lVar4);
      }
      if (memorySize - sVar3 < 0x10) {
        lVar4 = uVar5 - 0x10;
        do {
          add(this,"   ");
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0);
      }
      if (memorySize - sVar3 < 8) {
        add(this," ");
      }
      add(this,"|");
      if (memorySize != sVar3) {
        lVar4 = 0;
        do {
          cVar1 = *(char *)((long)memory + lVar4 + sVar3);
          cVar2 = '.';
          if (0xa0 < (byte)(cVar1 + 0x81U)) {
            cVar2 = cVar1;
          }
          add(this,"%c",(ulong)(uint)(int)cVar2);
          lVar4 = lVar4 + 1;
        } while (uVar5 + (uVar5 == 0) != lVar4);
      }
      add(this,"|\n");
      sVar3 = sVar3 + uVar5;
    } while (sVar3 < memorySize);
  }
  return;
}

Assistant:

void SimpleStringBuffer::addMemoryDump(const void* memory, size_t memorySize)
{
    const unsigned char* byteMemory = (const unsigned char*)memory;
    const size_t maxLineBytes = 16;
    size_t currentPos = 0;
    size_t p;

    while (currentPos < memorySize) {
        add("    %04lx: ", (unsigned long) currentPos);
        size_t bytesInLine = memorySize - currentPos;
        if (bytesInLine > maxLineBytes) {
            bytesInLine = maxLineBytes;
        }
        const size_t leftoverBytes = maxLineBytes - bytesInLine;

        for (p = 0; p < bytesInLine; p++) {
            add("%02hx ", (unsigned short) byteMemory[currentPos + p]);
            if (p == ((maxLineBytes / 2) - 1)) {
                add(" ");
            }
        }
        for (p = 0; p < leftoverBytes; p++) {
            add("   ");
        }
        if (leftoverBytes > (maxLineBytes/2)) {
            add(" ");
        }

        add("|");
        for (p = 0; p < bytesInLine; p++) {
            char toAdd = (char)byteMemory[currentPos + p];
            if (toAdd < ' ' || toAdd > '~') {
                toAdd = '.';
            }
            add("%c", (int)toAdd);
        }
        add("|\n");
        currentPos += bytesInLine;
    }
}